

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O0

void __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor
          (ThreeAxisForceTorqueContactSensor *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  LinkSensor *in_stack_ffffffffffffff80;
  Transform local_78 [8];
  ThreeAxisForceTorqueContactSensorPrivateAttributes *in_stack_ffffffffffffff90;
  
  LinkSensor::LinkSensor(in_stack_ffffffffffffff80);
  *in_RDI = &PTR__ThreeAxisForceTorqueContactSensor_004fab18;
  pvVar1 = operator_new(0xc0);
  ThreeAxisForceTorqueContactSensorPrivateAttributes::
  ThreeAxisForceTorqueContactSensorPrivateAttributes(in_stack_ffffffffffffff90);
  in_RDI[1] = pvVar1;
  std::__cxx11::string::operator=((string *)in_RDI[1],"");
  iDynTree::Transform::Identity();
  iDynTree::Transform::operator=((Transform *)(in_RDI[1] + 0x20),local_78);
  *(undefined8 *)(in_RDI[1] + 0x80) = 0xffffffffffffffff;
  std::__cxx11::string::operator=((string *)(in_RDI[1] + 0x88),"");
  return;
}

Assistant:

ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor()
{
    this->pimpl = new ThreeAxisForceTorqueContactSensorPrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link_H_sensor = Transform::Identity();
    this->pimpl->parent_link_index = -1;
    this->pimpl->parent_link_name = "";

}